

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_reader.cpp
# Opt level: O0

void __thiscall HawkTracer::parser::ProtocolReader::stop(ProtocolReader *this)

{
  bool bVar1;
  pointer pSVar2;
  ProtocolReader *this_local;
  
  std::atomic<bool>::operator=(&this->_is_running,false);
  bVar1 = std::thread::joinable(&this->_thread);
  if (bVar1) {
    std::thread::join();
  }
  pSVar2 = std::
           unique_ptr<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
           ::operator->(&this->_stream);
  (*pSVar2->_vptr_Stream[5])();
  return;
}

Assistant:

void ProtocolReader::stop()
{
    _is_running = false;
    if (_thread.joinable())
    {
        _thread.join();
    }
    _stream->stop();
}